

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator
fmt::v10::detail::write_escaped_cp<fmt::v10::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  byte *pbVar8;
  undefined1 local_20;
  char local_1f [6];
  char local_19;
  
  pcVar6 = &stack0xffffffffffffffe8;
  uVar7 = escape->cp;
  uVar4 = (ulong)uVar7;
  if (((uVar4 < 0x28) && ((0x8400002600U >> (uVar4 & 0x3f) & 1) != 0)) || (uVar7 == 0x5c)) {
    pcVar6 = (char *)(out.count_ + 2);
  }
  else {
    if (uVar7 < 0x100) {
      pcVar6 = local_1f + 1;
      pcVar5 = local_1f;
      do {
        uVar3 = (uint)uVar4;
        *pcVar5 = "0123456789abcdef"[uVar3 & 0xf];
        uVar7 = uVar7 >> 4;
        pcVar5 = pcVar5 + -1;
        uVar4 = (ulong)uVar7;
      } while (0xf < uVar3);
    }
    else if (uVar7 < 0x10000) {
      pcVar6 = local_1f + 3;
      pcVar5 = local_1f + 2;
      do {
        uVar3 = (uint)uVar4;
        *pcVar5 = "0123456789abcdef"[uVar3 & 0xf];
        uVar7 = uVar7 >> 4;
        pcVar5 = pcVar5 + -1;
        uVar4 = (ulong)uVar7;
      } while (0xf < uVar3);
    }
    else {
      if (0x10ffff < uVar7) {
        pbVar8 = (byte *)escape->begin;
        pbVar1 = (byte *)escape->end;
        if ((long)pbVar1 - (long)pbVar8 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                      ,0x189,"negative value");
        }
        if (pbVar8 == pbVar1) {
          return (counting_iterator)out.count_;
        }
        do {
          pcVar6 = local_1f;
          uVar7 = (uint)*pbVar8;
          do {
            *pcVar6 = "0123456789abcdef"[uVar7 & 0xf];
            pcVar6 = pcVar6 + -1;
            bVar2 = 0xf < uVar7;
            uVar7 = uVar7 >> 4;
          } while (bVar2);
          out.count_ = out.count_ + 4;
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar1);
        return (counting_iterator)out.count_;
      }
      pcVar5 = &local_19;
      do {
        uVar3 = (uint)uVar4;
        *pcVar5 = "0123456789abcdef"[uVar3 & 0xf];
        uVar7 = uVar7 >> 4;
        pcVar5 = pcVar5 + -1;
        uVar4 = (ulong)uVar7;
      } while (0xf < uVar3);
    }
    pcVar6 = pcVar6 + (out.count_ - (long)&local_20) + 2;
  }
  return (counting_iterator)(size_t)pcVar6;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (escape.cp < 0x100) {
      return write_codepoint<2, Char>(out, 'x', escape.cp);
    }
    if (escape.cp < 0x10000) {
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    }
    if (escape.cp < 0x110000) {
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}